

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

StaticError * __thiscall
jsonnet::internal::anon_unknown_0::Parser::unexpected
          (StaticError *__return_storage_ptr__,Parser *this,Token *tok,string *while_)

{
  ostream *poVar1;
  stringstream ss;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"unexpected: ");
  internal::operator<<(poVar1,*(Kind *)&this->tokens);
  poVar1 = std::operator<<(poVar1," while ");
  std::operator<<(poVar1,(string *)tok);
  std::__cxx11::stringbuf::str();
  StaticError::StaticError(__return_storage_ptr__,(LocationRange *)(this + 8),&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

StaticError unexpected(const Token &tok, const std::string &while_)
    {
        std::stringstream ss;
        ss << "unexpected: " << tok.kind << " while " << while_;
        return StaticError(tok.location, ss.str());
    }